

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

Curl_handler * Curl_builtin_scheme(char *scheme,size_t schemelen)

{
  Curl_handler *pCVar1;
  int iVar2;
  Curl_handler *p;
  Curl_handler **pp;
  size_t schemelen_local;
  char *scheme_local;
  
  pp = (Curl_handler **)schemelen;
  if (schemelen == 0xffffffffffffffff) {
    pp = (Curl_handler **)strlen(scheme);
  }
  p = (Curl_handler *)protocols;
  while( true ) {
    pCVar1 = (Curl_handler *)p->scheme;
    if (pCVar1 == (Curl_handler *)0x0) {
      return (Curl_handler *)0x0;
    }
    iVar2 = Curl_strncasecompare(pCVar1->scheme,scheme,(size_t)pp);
    if ((iVar2 != 0) && (pCVar1->scheme[(long)pp] == '\0')) break;
    p = (Curl_handler *)&p->setup_connection;
  }
  return pCVar1;
}

Assistant:

const struct Curl_handler *Curl_builtin_scheme(const char *scheme,
                                               size_t schemelen)
{
  const struct Curl_handler * const *pp;
  const struct Curl_handler *p;
  /* Scan protocol handler table and match against 'scheme'. The handler may
     be changed later when the protocol specific setup function is called. */
  if(schemelen == CURL_ZERO_TERMINATED)
    schemelen = strlen(scheme);
  for(pp = protocols; (p = *pp) != NULL; pp++)
    if(strncasecompare(p->scheme, scheme, schemelen) && !p->scheme[schemelen])
      /* Protocol found in table. */
      return p;
  return NULL; /* not found */
}